

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ExpressionResultBuilder * __thiscall
Catch::ExpressionResultBuilder::operator=
          (ExpressionResultBuilder *this,ExpressionResultBuilder *other)

{
  long *local_48;
  long local_40;
  long local_38 [2];
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&(this->m_data).message);
  (this->m_data).resultType = (other->m_data).resultType;
  (this->m_exprComponents).shouldNegate = (other->m_exprComponents).shouldNegate;
  std::__cxx11::string::_M_assign((string *)&(this->m_exprComponents).lhs);
  std::__cxx11::string::_M_assign((string *)&(this->m_exprComponents).rhs);
  std::__cxx11::string::_M_assign((string *)&(this->m_exprComponents).op);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0xb8);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->m_stream,(char *)local_48,local_40);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return this;
}

Assistant:

ExpressionResultBuilder& ExpressionResultBuilder::operator=(const ExpressionResultBuilder& other ) {
        m_data = other.m_data;
        m_exprComponents = other.m_exprComponents;
        m_stream.str("");
        m_stream << other.m_stream.str();
        return *this;
    }